

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O0

void __thiscall
DIS::StandardVariableSpecification::unmarshal
          (StandardVariableSpecification *this,DataStream *dataStream)

{
  undefined1 local_80 [8];
  SimulationManagementPduHeader x;
  size_t idx;
  DataStream *dataStream_local;
  StandardVariableSpecification *this_local;
  
  DataStream::operator>>(dataStream,&this->_numberOfStandardVariableRecords);
  std::
  vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>::
  clear(&this->_standardVariables);
  x._recevingID._entityNumber = 0;
  x._recevingID._26_6_ = 0;
  for (; (ulong)x._recevingID._24_8_ < (ulong)this->_numberOfStandardVariableRecords;
      x._recevingID._24_8_ = x._recevingID._24_8_ + 1) {
    SimulationManagementPduHeader::SimulationManagementPduHeader
              ((SimulationManagementPduHeader *)local_80);
    SimulationManagementPduHeader::unmarshal((SimulationManagementPduHeader *)local_80,dataStream);
    std::
    vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
    ::push_back(&this->_standardVariables,(value_type *)local_80);
    SimulationManagementPduHeader::~SimulationManagementPduHeader
              ((SimulationManagementPduHeader *)local_80);
  }
  return;
}

Assistant:

void StandardVariableSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfStandardVariableRecords;

     _standardVariables.clear();
     for(size_t idx = 0; idx < _numberOfStandardVariableRecords; idx++)
     {
        SimulationManagementPduHeader x;
        x.unmarshal(dataStream);
        _standardVariables.push_back(x);
     }
}